

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

FMformat_order FMformat_cmp(FMFormat_conflict format1,FMFormat_conflict format2)

{
  char *pcVar1;
  char *__s2;
  FMFormat_conflict format1_00;
  FMFormat_conflict format2_00;
  char **ppcVar2;
  int iVar3;
  FMformat_order FVar4;
  FMformat_order FVar5;
  FMFieldList list;
  FMFieldList list_00;
  FMFieldList p_Var6;
  long lVar7;
  FMFormat_conflict *__ptr;
  int iVar8;
  FMFormat_conflict *pp_Var9;
  size_t __nmemb;
  FMFieldList p_Var10;
  size_t __nmemb_00;
  int iVar11;
  long lVar12;
  FMFormat_conflict *pp_Var13;
  FMformat_order local_8c;
  FMformat_order local_80;
  FMFormat_conflict *local_78;
  
  list = copy_field_list(format1->field_list);
  list_00 = copy_field_list(format2->field_list);
  __nmemb = 0xffffffffffffffff;
  p_Var6 = list;
  do {
    __nmemb = __nmemb + 1;
    ppcVar2 = &p_Var6->field_name;
    p_Var6 = p_Var6 + 1;
  } while (*ppcVar2 != (char *)0x0);
  __nmemb_00 = 0xffffffffffffffff;
  p_Var6 = list_00;
  do {
    __nmemb_00 = __nmemb_00 + 1;
    ppcVar2 = &p_Var6->field_name;
    p_Var6 = p_Var6 + 1;
  } while (*ppcVar2 != (char *)0x0);
  qsort(list,__nmemb,0x18,field_name_compar);
  qsort(list_00,__nmemb_00,0x18,field_name_compar);
  local_8c = Format_Equal;
  iVar11 = 0;
  iVar8 = 0;
  while( true ) {
    if (((int)__nmemb <= iVar11) || ((int)__nmemb_00 <= iVar8)) break;
    lVar7 = (long)iVar11;
    p_Var6 = list + lVar7;
    pcVar1 = list[lVar7].field_name;
    lVar12 = (long)iVar8;
    p_Var10 = list_00 + lVar12;
    __s2 = list_00[lVar12].field_name;
    iVar3 = strcmp(pcVar1,__s2);
    if (iVar3 == 0) {
      iVar3 = field_type_eq(p_Var6->field_type,p_Var10->field_type);
      if (iVar3 == 0) {
        return Format_Incompatible;
      }
    }
    else if (iVar3 < 0) {
      if (local_8c == Format_Less) goto LAB_0011afb2;
      lVar12 = 0;
      while (iVar3 = strcmp(p_Var6->field_name,__s2), iVar3 < 0) {
        lVar12 = lVar12 + -1;
        p_Var6 = p_Var6 + 1;
        if (lVar7 - __nmemb == lVar12) goto LAB_0011afb2;
      }
      iVar11 = ~(uint)lVar12 + iVar11;
      iVar8 = iVar8 + -1;
      local_8c = Format_Greater;
    }
    else {
      if (local_8c == Format_Greater) goto LAB_0011afb2;
      lVar7 = 0;
      while (iVar3 = strcmp(pcVar1,p_Var10->field_name), 0 < iVar3) {
        lVar7 = lVar7 + -1;
        p_Var10 = p_Var10 + 1;
        if (lVar12 - __nmemb_00 == lVar7) goto LAB_0011afb2;
      }
      iVar11 = iVar11 + -1;
      iVar8 = ~(uint)lVar7 + iVar8;
      local_8c = Format_Less;
    }
    iVar11 = iVar11 + 1;
    iVar8 = iVar8 + 1;
  }
  if (iVar11 < (int)__nmemb) {
    if (local_8c == Format_Less) {
LAB_0011afb2:
      local_78 = (FMFormat_conflict *)0x0;
      __ptr = (FMFormat_conflict *)0x0;
      local_80 = Format_Incompatible;
      goto LAB_0011afb4;
    }
    local_8c = Format_Greater;
  }
  else if (iVar8 < (int)__nmemb_00) {
    if (local_8c == Format_Greater) goto LAB_0011afb2;
    local_8c = Format_Less;
  }
  __ptr = get_subformats_IOformat(format1);
  local_78 = get_subformats_IOformat(format2);
  for (pp_Var9 = __ptr; format1_00 = *pp_Var9, local_80 = local_8c,
      format1_00 != (FMFormat_conflict)0x0; pp_Var9 = pp_Var9 + 1) {
    FVar5 = local_8c;
    if (format1_00 != format1) {
      pcVar1 = format1_00->format_name;
      pp_Var13 = local_78;
      do {
        format2_00 = *pp_Var13;
        if (format2_00 == (FMFormat_conflict)0x0) goto LAB_0011af94;
        iVar11 = strcmp(pcVar1,format2_00->format_name);
        pp_Var13 = pp_Var13 + 1;
      } while (iVar11 != 0);
      FVar4 = FMformat_cmp(format1_00,format2_00);
      if ((FVar4 != Format_Equal) &&
         ((local_80 = FVar4, FVar4 == Format_Incompatible ||
          ((FVar5 = FVar4, local_8c != Format_Equal &&
           (FVar5 = local_8c, local_80 = Format_Incompatible, local_8c != FVar4)))))) break;
    }
LAB_0011af94:
    local_8c = FVar5;
  }
LAB_0011afb4:
  free_field_list(list);
  free_field_list(list_00);
  free(__ptr);
  free(local_78);
  return local_80;
}

Assistant:

FMformat_order
FMformat_cmp(FMFormat format1, FMFormat format2)
{
    FMformat_order tmp_result = Format_Equal;
    FMFieldList field_list1 =
	copy_field_list(field_list_of_IOformat(format1));
    FMFieldList field_list2 =
	copy_field_list(field_list_of_IOformat(format2));
    FMFormat *subformats1 = NULL, *subformats2 = NULL, *tmp_subformats = NULL;
    int field_count1, field_count2;
    int i, j, limit;

    /* count fields */
    for (field_count1 = 0; field_list1[field_count1].field_name != NULL;
	 field_count1++);

    /* count fields */
    for (field_count2 = 0; field_list2[field_count2].field_name != NULL;
	 field_count2++);

    qsort(field_list1, field_count1, sizeof(FMField), field_name_compar);
    qsort(field_list2, field_count2, sizeof(FMField), field_name_compar);

    limit = field_count1;
    if (field_count2 < limit)
	limit = field_count2;
    i = j = 0;
    while ((i < field_count1) && (j < field_count2)) {
	int name_cmp;
	if ((name_cmp = strcmp(field_list1[i].field_name,
			       field_list2[j].field_name)) == 0) {
	    /* fields have same name */
	    if (!field_type_eq(field_list1[i].field_type,
				  field_list2[j].field_type)) {
		return Format_Incompatible;
	    }
	} else if (name_cmp < 0) {
	    /* name_cmp>0  a field in field_list1 that doesn't appear in 2 */
	    if (tmp_result == Format_Less) {
		/* we previously found the opposite */
		tmp_result = Format_Incompatible;
		goto free_lists;
	    } else {
		/* tentatively decide that list1 is a superset of 2 */
		tmp_result = Format_Greater;
	    }
	    /* skip fields in 1 until we find the next field in 2 */
	    while (strcmp(field_list1[i].field_name,
			  field_list2[j].field_name) < 0) {
		i++;
		if (i == field_count1) {
		    /* didn't find one */
		    tmp_result = Format_Incompatible;
		    goto free_lists;
		}
	    }
	    i--;
	    j--;
	} else {
	    /* name_cmp>0  a field in field_list2 that doesn't appear in 1 */
	    if (tmp_result == Format_Greater) {
		tmp_result = Format_Incompatible;
		goto free_lists;
	    } else {
		tmp_result = Format_Less;
	    }
	    /* skip fields in field_list2 until we find matching */
	    while (strcmp(field_list1[i].field_name,
			  field_list2[j].field_name) > 0) {
		j++;
		if (j == field_count2) {
		    /* didn't find one */
		    tmp_result = Format_Incompatible;
		    goto free_lists;
		}
	    }
	    i--;
	    j--;
	}
	i++;
	j++;
    }
    if (i < field_count1) {
	if (tmp_result == Format_Less) {
	    tmp_result = Format_Incompatible;
	    goto free_lists;
	} else {
	    tmp_result = Format_Greater;
	}
    } else if (j < field_count2) {
	if (tmp_result == Format_Greater) {
	    tmp_result = Format_Incompatible;
	    goto free_lists;
	} else {
	    tmp_result = Format_Less;
	}
    }
    /* go through subformats */
    tmp_subformats = subformats1 = get_subformats_IOformat(format1);
    subformats2 = get_subformats_IOformat(format2);

    while (*subformats1 != NULL) {
	char *sub1_name = name_of_FMformat(*subformats1);
	int i = 0;
	if (*subformats1 == format1) {
	    /* self appears in subformat list, skip it */
	    subformats1++;
	    continue;
	}
	while (subformats2[i] != NULL) {
	    if (strcmp(sub1_name, name_of_FMformat(subformats2[i])) == 0) {
		/* same name, compare */
		FMformat_order sub_result;
		sub_result = FMformat_cmp(*subformats1,
					  subformats2[i]);
		if (sub_result == Format_Incompatible) {
		    tmp_result = Format_Incompatible;
		    goto free_lists;
		}
		if (sub_result != Format_Equal) {
		    /* subformats are not equal! */
		    if (tmp_result == Format_Equal) {
			/* we thought they were equal before */
			tmp_result = sub_result;
		    } else if (tmp_result != sub_result) {
			tmp_result = Format_Incompatible;
			goto free_lists;
		    }
		}
		break;
	    }
	    i++;
	}
	subformats1++;
    }

 free_lists:
    free_field_list(field_list1);
    free_field_list(field_list2);
    if (tmp_subformats) free(tmp_subformats);
    if (subformats2) free(subformats2);
    return tmp_result;
}